

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O3

int st__lookup_int(st__table *table,char *key,int *value)

{
  st__table_entry **ppsVar1;
  st__hash_func_type p_Var2;
  st__compare_func_type p_Var3;
  int iVar4;
  int iVar5;
  st__table_entry *psVar6;
  st__table_entry **ppsVar7;
  
  p_Var2 = table->hash;
  if (p_Var2 == st__ptrhash) {
    iVar4 = (int)(((ulong)key >> 2) % (ulong)(long)table->num_bins);
  }
  else if (p_Var2 == st__numhash) {
    iVar5 = (int)key;
    iVar4 = -iVar5;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    iVar4 = iVar4 % table->num_bins;
  }
  else {
    iVar4 = (*p_Var2)(key,table->num_bins);
  }
  psVar6 = table->bins[iVar4];
  if (psVar6 != (st__table_entry *)0x0) {
    ppsVar7 = table->bins + iVar4;
    do {
      p_Var3 = table->compare;
      if (p_Var3 == st__numcmp || p_Var3 == st__ptrcmp) {
        if (psVar6->key == key) {
LAB_00499369:
          if (table->reorder_flag != 0) {
            *ppsVar7 = psVar6->next;
            ppsVar7 = table->bins;
            psVar6->next = ppsVar7[iVar4];
            ppsVar7[iVar4] = psVar6;
          }
          if (value != (int *)0x0) {
            *value = *(int *)&psVar6->record;
            return 1;
          }
          return 1;
        }
      }
      else {
        iVar5 = (*p_Var3)(key,psVar6->key);
        if (iVar5 == 0) goto LAB_00499369;
      }
      ppsVar1 = &psVar6->next;
      ppsVar7 = &psVar6->next;
      psVar6 = *ppsVar1;
    } while (*ppsVar1 != (st__table_entry *)0x0);
  }
  return 0;
}

Assistant:

int
 st__lookup_int( st__table *table, char *key, int *value)
{
    int hash_val;
    st__table_entry *ptr, **last;

    hash_val = do_hash(key, table);

    FIND_ENTRY(table, hash_val, key, ptr, last);
    
    if (ptr == NULL) {
    return 0;
    } else {
    if (value != 0) {
        *value = (long) ptr->record;
    }
    return 1;
    }
}